

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_behaviour_Test::
rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_behaviour_Test
          (rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_behaviour_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0019ce58;
  return;
}

Assistant:

TEST(rate_adaptive_code_from_decoder, obtain_from_advanced_encoder_behaviour) {
    std::vector<std::uint16_t> rows_to_combine{}; // not used here!
    RateAdaptiveCode<std::uint16_t> H1(encoder_2048x6144_4663d91.get_pos_varn(), rows_to_combine);

    auto H2 = get_code_big_wra();

    {
        std::vector<std::uint8_t> in = get_bitstring<std::uint8_t>(H1.getNCols());
        std::vector<std::uint8_t> out(H1.get_n_rows_mother_matrix());

        std::cout << "input hash: " << hash_vector(in) << std::endl;
        H1.encode_no_ra(in, out);
        std::cout << "output hash: " << hash_vector(out) << std::endl;

        EXPECT_EQ(hash_vector(out), 2814594723);
    }
    {
        std::vector<std::uint8_t> in = get_bitstring<std::uint8_t>(H2.getNCols());
        std::vector<std::uint8_t> out(H2.get_n_rows_mother_matrix());

        std::cout << "input hash: " << hash_vector(in) << std::endl;
        H2.encode_no_ra(in, out);
        std::cout << "output hash: " << hash_vector(out) << std::endl;

        EXPECT_EQ(hash_vector(out), 2814594723);
    }
}